

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget(QGraphicsProxyWidgetPrivate *this)

{
  QGraphicsItem *pQVar1;
  QObject *pQVar2;
  QWidget *widget;
  bool bVar3;
  QGraphicsWidget *object;
  QGraphicsProxyWidget *this_00;
  QPoint QVar4;
  QSize QVar5;
  undefined8 uVar6;
  QGraphicsItem *pQVar7;
  long in_FS_OFFSET;
  QPoint local_70;
  QRectF local_68;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pQVar7 = pQVar1 + -1;
  if (pQVar1 == (QGraphicsItem *)0x0) {
    pQVar7 = (QGraphicsItem *)0x0;
  }
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->widget);
  if (bVar3) {
    local_48.w = -NAN;
    local_48.h = -NAN;
    local_48.xp = -NAN;
    local_48.yp = -NAN;
    QRectF::QRectF(&local_48,(QRect *)(*(long *)((this->widget).wp.value + 0x20) + 0x14));
    pQVar2 = (this->widget).wp.value;
    widget = *(QWidget **)(*(long *)(pQVar2 + 8) + 0x10);
    if ((widget != (QWidget *)0x0) && ((*(uint *)(*(long *)(pQVar2 + 0x20) + 0xc) & 1) != 0)) {
      object = QGraphicsItem::parentWidget(pQVar7 + 1);
      this_00 = (QGraphicsProxyWidget *)
                QtPrivate::qobject_cast_helper<QGraphicsProxyWidget*,QObject>((QObject *)object);
      if (this_00 != (QGraphicsProxyWidget *)0x0) {
        QGraphicsProxyWidget::subWidgetRect(&local_68,this_00,widget);
        local_70 = QWidget::pos((QWidget *)(this->widget).wp.value);
        QVar4 = QWidget::mapFromGlobal(widget,&local_70);
        local_48.xp = (double)QVar4.xp.m_i.m_i + local_68.xp;
        local_48.yp = (double)QVar4.yp.m_i.m_i + local_68.yp;
      }
    }
    QVar5 = QWidget::size((QWidget *)(this->widget).wp.value);
    if (((ulong)QVar5 & 0x8000000080000000) != 0) {
      uVar6 = (**(code **)(*(long *)(this->widget).wp.value + 0x70))();
      local_48.w = (qreal)(int)uVar6;
      local_48.h = (qreal)(int)((ulong)uVar6 >> 0x20);
    }
    *(ushort *)&this->field_0x244 = (ushort)*(undefined4 *)&this->field_0x244 & 0xfff0 | 10;
    (*pQVar7->_vptr_QGraphicsItem[0xc])(pQVar7,&local_48);
    this->field_0x244 = this->field_0x244 & 0xf0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget()
{
    Q_Q(QGraphicsProxyWidget);
    if (!widget)
        return;

    QRectF widgetGeometry = widget->geometry();
    QWidget *parentWidget = widget->parentWidget();
    if (widget->isWindow()) {
        QGraphicsProxyWidget *proxyParent = nullptr;
        if (parentWidget && (proxyParent = qobject_cast<QGraphicsProxyWidget *>(q->parentWidget()))) {
            // Nested window proxy (e.g., combobox popup), map widget to the
            // parent widget's global coordinates, and map that to the parent
            // proxy's child coordinates.
            widgetGeometry.moveTo(proxyParent->subWidgetRect(parentWidget).topLeft()
                                  + parentWidget->mapFromGlobal(widget->pos()));
        }
    }

    // Adjust to size hint if the widget has never been resized.
    if (!widget->size().isValid())
        widgetGeometry.setSize(widget->sizeHint());

    // Assign new geometry.
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    q->setGeometry(widgetGeometry);
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}